

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_compressionParameters *
ZSTD_getCParamsFromCCtxParams
          (ZSTD_CCtx_params *CCtxParams,U64 srcSizeHint,size_t dictSize,ZSTD_cParamMode_e mode)

{
  ZSTD_compressionParameters cParams_00;
  size_t sVar1;
  undefined8 in_RCX;
  size_t in_RDX;
  unsigned_long_long in_RSI;
  ZSTD_compressionParameters *in_RDI;
  undefined4 unaff_retaddr;
  int unaff_retaddr_00;
  ZSTD_compressionParameters in_stack_00000010;
  ZSTD_compressionParameters cParams;
  undefined4 in_stack_ffffffffffffff94;
  ZSTD_compressionParameters *pZVar2;
  ZSTD_strategy in_stack_ffffffffffffffa8;
  ZSTD_compressionParameters local_54;
  ZSTD_compressionParameters local_38;
  
  if ((in_RDX == 0xffffffffffffffff) && (0 < *(int *)(in_RSI + 0x40))) {
    in_RDX = (size_t)*(int *)(in_RSI + 0x40);
  }
  pZVar2 = in_RDI;
  ZSTD_getCParams_internal
            (unaff_retaddr_00,in_RSI,in_RDX,(ZSTD_cParamMode_e)((ulong)in_RCX >> 0x20));
  local_38._0_8_ = local_54._0_8_;
  local_38.strategy = local_54.strategy;
  if (*(int *)(in_RSI + 0x60) == 1) {
    local_38.chainLog = local_54.chainLog;
    local_38.windowLog = 0x1b;
  }
  ZSTD_overrideCParams(&local_38,(ZSTD_compressionParameters *)(in_RSI + 4));
  cParams_00.chainLog = in_stack_ffffffffffffff94;
  cParams_00.windowLog = local_38.strategy;
  cParams_00._8_8_ = in_RDI;
  cParams_00._16_8_ = pZVar2;
  cParams_00.strategy = in_stack_ffffffffffffffa8;
  sVar1 = ZSTD_checkCParams(cParams_00);
  if (sVar1 == 0) {
    ZSTD_adjustCParams_internal
              (in_stack_00000010,CONCAT44(unaff_retaddr_00,unaff_retaddr),in_RSI,
               (ZSTD_cParamMode_e)(in_RDX >> 0x20),(ZSTD_paramSwitch_e)in_RDX);
    return pZVar2;
  }
  __assert_fail("!ZSTD_checkCParams(cParams)",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                ,0x56f1,
                "ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(const ZSTD_CCtx_params *, U64, size_t, ZSTD_cParamMode_e)"
               );
}

Assistant:

ZSTD_compressionParameters ZSTD_getCParamsFromCCtxParams(
        const ZSTD_CCtx_params* CCtxParams, U64 srcSizeHint, size_t dictSize, ZSTD_cParamMode_e mode)
{
    ZSTD_compressionParameters cParams;
    if (srcSizeHint == ZSTD_CONTENTSIZE_UNKNOWN && CCtxParams->srcSizeHint > 0) {
      srcSizeHint = CCtxParams->srcSizeHint;
    }
    cParams = ZSTD_getCParams_internal(CCtxParams->compressionLevel, srcSizeHint, dictSize, mode);
    if (CCtxParams->ldmParams.enableLdm == ZSTD_ps_enable) cParams.windowLog = ZSTD_LDM_DEFAULT_WINDOW_LOG;
    ZSTD_overrideCParams(&cParams, &CCtxParams->cParams);
    assert(!ZSTD_checkCParams(cParams));
    /* srcSizeHint == 0 means 0 */
    return ZSTD_adjustCParams_internal(cParams, srcSizeHint, dictSize, mode, CCtxParams->useRowMatchFinder);
}